

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::UnicodeString::setTo
          (UnicodeString *this,UBool isTerminated,ConstChar16Ptr *textPtr,int32_t textLength)

{
  char16_t *s;
  int32_t local_5c;
  UChar *text;
  int32_t textLength_local;
  ConstChar16Ptr *textPtr_local;
  UBool isTerminated_local;
  UnicodeString *this_local;
  
  if (((this->fUnion).fStackFields.fLengthAndFlags & 0x10U) == 0) {
    s = ConstChar16Ptr::operator_cast_to_char16_t_(textPtr);
    if (s == (char16_t *)0x0) {
      releaseArray(this);
      setToEmpty(this);
    }
    else if (((textLength < -1) || ((textLength == -1 && (isTerminated == '\0')))) ||
            ((-1 < textLength && ((isTerminated != '\0' && (s[textLength] != L'\0')))))) {
      setToBogus(this);
    }
    else {
      releaseArray(this);
      text._4_4_ = textLength;
      if (textLength == -1) {
        text._4_4_ = u_strlen_63(s);
      }
      (this->fUnion).fStackFields.fLengthAndFlags = 8;
      if (isTerminated == '\0') {
        local_5c = text._4_4_;
      }
      else {
        local_5c = text._4_4_ + 1;
      }
      setArray(this,s,text._4_4_,local_5c);
    }
  }
  return this;
}

Assistant:

UnicodeString &
UnicodeString::setTo(UBool isTerminated,
                     ConstChar16Ptr textPtr,
                     int32_t textLength)
{
  if(fUnion.fFields.fLengthAndFlags & kOpenGetBuffer) {
    // do not modify a string that has an "open" getBuffer(minCapacity)
    return *this;
  }

  const UChar *text = textPtr;
  if(text == NULL) {
    // treat as an empty string, do not alias
    releaseArray();
    setToEmpty();
    return *this;
  }

  if( textLength < -1 ||
      (textLength == -1 && !isTerminated) ||
      (textLength >= 0 && isTerminated && text[textLength] != 0)
  ) {
    setToBogus();
    return *this;
  }

  releaseArray();

  if(textLength == -1) {
    // text is terminated, or else it would have failed the above test
    textLength = u_strlen(text);
  }
  fUnion.fFields.fLengthAndFlags = kReadonlyAlias;
  setArray((UChar *)text, textLength, isTerminated ? textLength + 1 : textLength);
  return *this;
}